

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::mouseMoveEvent(QLineEdit *this,QMouseEvent *e)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  LayoutDirection LVar6;
  int iVar7;
  QLineEditPrivate *this_00;
  long in_FS_OFFSET;
  int currentPos;
  int startPos;
  bool select;
  QLineEditPrivate *d;
  MouseButton in_stack_fffffffffffffefc;
  undefined1 mark;
  QWidgetLineControl *in_stack_ffffffffffffff00;
  QLineEditPrivate *in_stack_ffffffffffffff08;
  QLineEditPrivate *pQVar8;
  QWidgetLineControl *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  QLineEditPrivate *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_c;
  long local_8;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QLineEdit *)0x5c5f85);
  QSinglePointEvent::buttons((QSinglePointEvent *)in_stack_ffffffffffffff00);
  local_c.super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorage<Qt::MouseButton>)
       QFlags<Qt::MouseButton>::operator&
                 ((QFlags<Qt::MouseButton> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  mark = (undefined1)(in_stack_fffffffffffffefc >> 0x18);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  if (IVar2 != 0) {
    bVar1 = QBasicTimer::isActive(&this_00->dndTimer);
    if (bVar1) {
      in_stack_ffffffffffffff30 = (QLineEditPrivate *)&this_00->mousePressPos;
      QSinglePointEvent::position((QSinglePointEvent *)0x5c5ffe);
      QPointF::toPoint((QPointF *)in_stack_ffffffffffffff10);
      ::operator-((QPoint *)in_stack_ffffffffffffff10,(QPoint *)in_stack_ffffffffffffff08);
      iVar7 = QPoint::manhattanLength((QPoint *)in_stack_ffffffffffffff10);
      iVar3 = QApplication::startDragDistance();
      if (iVar3 < iVar7) {
        QLineEditPrivate::drag((QLineEditPrivate *)CONCAT44(iVar7,in_stack_ffffffffffffff38));
      }
    }
    else {
      in_stack_ffffffffffffff2c = in_stack_ffffffffffffff2c & 0xffffff;
      if (0 < this_00->mouseYThreshold) {
        QSinglePointEvent::position((QSinglePointEvent *)0x5c6091);
        QPointF::toPoint((QPointF *)in_stack_ffffffffffffff10);
        in_stack_ffffffffffffff28 = QPoint::y((QPoint *)0x5c60c5);
        iVar3 = QPoint::y((QPoint *)0x5c60da);
        in_stack_ffffffffffffff2c =
             CONCAT13(iVar3 + this_00->mouseYThreshold < in_stack_ffffffffffffff28,
                      (int3)in_stack_ffffffffffffff2c);
      }
      if ((char)(in_stack_ffffffffffffff2c >> 0x18) == '\0') {
        bVar1 = false;
        if (0 < this_00->mouseYThreshold) {
          QSinglePointEvent::position((QSinglePointEvent *)0x5c615e);
          QPointF::toPoint((QPointF *)in_stack_ffffffffffffff10);
          iVar4 = QPoint::y((QPoint *)0x5c6192);
          iVar3 = this_00->mouseYThreshold;
          iVar5 = QPoint::y((QPoint *)0x5c61b2);
          bVar1 = iVar4 + iVar3 < iVar5;
        }
        if (bVar1) {
          LVar6 = QWidget::layoutDirection((QWidget *)0x5c61d5);
          if (LVar6 == RightToLeft) {
            QWidgetLineControl::end(in_stack_ffffffffffffff00,(bool)mark);
          }
          else {
            QWidgetLineControl::home(in_stack_ffffffffffffff00,(bool)mark);
          }
        }
        else {
          bVar1 = QWidgetLineControl::composeMode(in_stack_ffffffffffffff00);
          if (bVar1) {
            pQVar8 = this_00;
            QPoint::x((QPoint *)0x5c6242);
            iVar7 = QLineEditPrivate::xToPos
                              (in_stack_ffffffffffffff08,
                               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                               (CursorPosition)in_stack_ffffffffffffff00);
            QSinglePointEvent::position((QSinglePointEvent *)0x5c6268);
            QPointF::toPoint((QPointF *)pQVar8);
            QPoint::x((QPoint *)0x5c629c);
            iVar3 = QLineEditPrivate::xToPos
                              (in_stack_ffffffffffffff08,
                               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                               (CursorPosition)in_stack_ffffffffffffff00);
            if (iVar7 != iVar3) {
              QWidgetLineControl::setSelection
                        ((QWidgetLineControl *)this_00,(int)((ulong)pQVar8 >> 0x20),(int)pQVar8);
            }
          }
          else {
            pQVar8 = (QLineEditPrivate *)this_00->control;
            QSinglePointEvent::position((QSinglePointEvent *)0x5c62fc);
            QPointF::toPoint((QPointF *)in_stack_ffffffffffffff10);
            QPoint::x((QPoint *)0x5c632a);
            QLineEditPrivate::xToPos(pQVar8,(int)((ulong)this_00 >> 0x20),(CursorPosition)this_00);
            QWidgetLineControl::moveCursor
                      (in_stack_ffffffffffffff10,iVar7,SUB81((ulong)pQVar8 >> 0x38,0));
          }
        }
      }
      else {
        LVar6 = QWidget::layoutDirection((QWidget *)0x5c6108);
        if (LVar6 == RightToLeft) {
          QWidgetLineControl::home(in_stack_ffffffffffffff00,(bool)mark);
        }
        else {
          QWidgetLineControl::end(in_stack_ffffffffffffff00,(bool)mark);
        }
      }
    }
  }
  QLineEditPrivate::sendMouseEventToInputContext
            (in_stack_ffffffffffffff30,
             (QMouseEvent *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEdit::mouseMoveEvent(QMouseEvent * e)
{
    Q_D(QLineEdit);

    if (e->buttons() & Qt::LeftButton) {
#if QT_CONFIG(draganddrop)
        if (d->dndTimer.isActive()) {
            if ((d->mousePressPos - e->position().toPoint()).manhattanLength() > QApplication::startDragDistance())
                d->drag();
        } else
#endif
        {
#ifndef Q_OS_ANDROID
            const bool select = true;
#else
            const bool select = (d->imHints & Qt::ImhNoPredictiveText);
#endif
#ifndef QT_NO_IM
            if (d->mouseYThreshold > 0 && e->position().toPoint().y() > d->mousePressPos.y() + d->mouseYThreshold) {
                if (layoutDirection() == Qt::RightToLeft)
                    d->control->home(select);
                else
                    d->control->end(select);
            } else if (d->mouseYThreshold > 0 && e->position().toPoint().y() + d->mouseYThreshold < d->mousePressPos.y()) {
                if (layoutDirection() == Qt::RightToLeft)
                    d->control->end(select);
                else
                    d->control->home(select);
            } else if (d->control->composeMode() && select) {
                int startPos = d->xToPos(d->mousePressPos.x());
                int currentPos = d->xToPos(e->position().toPoint().x());
                if (startPos != currentPos)
                    d->control->setSelection(startPos, currentPos - startPos);

            } else
#endif
            {
                d->control->moveCursor(d->xToPos(e->position().toPoint().x()), select);
            }
        }
    }

    d->sendMouseEventToInputContext(e);
}